

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O3

void __thiscall lsim::Simulator::clear_components(Simulator *this)

{
  pointer ppSVar1;
  pointer puVar2;
  pointer pVVar3;
  
  std::
  vector<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>,_std::allocator<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>_>_>
  ::_M_erase_at_end(&this->m_components,
                    (this->m_components).
                    super__Vector_base<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>,_std::allocator<std::unique_ptr<lsim::SimComponent,_std::default_delete<lsim::SimComponent>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  ppSVar1 = (this->m_init_components).
            super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_init_components).
      super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppSVar1) {
    (this->m_init_components).
    super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppSVar1;
  }
  ppSVar1 = (this->m_independent_components).
            super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_independent_components).
      super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppSVar1) {
    (this->m_independent_components).
    super__Vector_base<lsim::SimComponent_*,_std::allocator<lsim::SimComponent_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppSVar1;
  }
  puVar2 = (this->m_pin_nodes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_pin_nodes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->m_pin_nodes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  pVVar3 = (this->m_pin_values).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_pin_values).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar3) {
    (this->m_pin_values).super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar3;
  }
  clear_nodes(this);
  return;
}

Assistant:

void Simulator::clear_components() {
    m_components.clear();
    m_init_components.clear();
    m_independent_components.clear();
    clear_pins();
    clear_nodes();
}